

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqCommsSS.cpp
# Opt level: O2

int __thiscall
helics::zeromq::ZmqCommsSS::processIncomingMessage
          (ZmqCommsSS *this,message_t *msg,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *connection_info)

{
  bool bVar1;
  size_t sVar2;
  void *pvVar3;
  ostream *out;
  ostream *poVar4;
  string *address;
  int iVar5;
  ConnectionStatus status;
  string_view message;
  basic_string_view<char,_std::char_traits<char>_> local_1c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sdata;
  int local_190;
  ActionMessage M;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  sVar2 = zmq::message_t::size(msg);
  if (sVar2 == 5) {
    pvVar3 = zmq::message_t::data(msg);
    sVar2 = zmq::message_t::size(msg);
    M._0_8_ = &M.dest_id;
    std::__cxx11::string::_M_construct<char_const*>((string *)&M,pvVar3,sVar2 + (long)pvVar3);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&M,
                            "close");
    std::__cxx11::string::~string((string *)&M);
    if (bVar1) {
      return -1;
    }
  }
  pvVar3 = zmq::message_t::data(msg);
  sVar2 = zmq::message_t::size(msg);
  ActionMessage::ActionMessage(&M,pvVar3,sVar2);
  if (((M.messageAction == cmd_protocol_priority) || (M.messageAction == cmd_protocol)) ||
     (M.messageAction == cmd_protocol_big)) {
    if (M.messageID != 299) {
      if (M.messageID == 0x130) {
        iVar5 = 0;
        CommsInterface::setTxStatus((CommsInterface *)this,CONNECTED);
        goto LAB_00231ead;
      }
      if (M.messageID == 0x14d) {
        message._M_str = "got new broker information";
        message._M_len = 0x1a;
        CommsInterface::logMessage((CommsInterface *)this,message);
        address = ActionMessage::getString_abi_cxx11_(&M,0);
        gmlc::networking::extractInterfaceAndPort
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                    *)&sdata,address);
        (this->super_NetworkCommsInterface).brokerPort = local_190;
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&sdata,"?");
        if (!bVar1) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &(this->super_NetworkCommsInterface).super_CommsInterface.brokerTargetAddress,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sdata);
        }
        std::__cxx11::string::~string((string *)&sdata);
LAB_00231e69:
        iVar5 = 5;
      }
      else {
        if (M.messageID == 0x16570bf) {
          status = TERMINATED;
        }
        else {
          if (M.messageID == 1999) {
            iVar5 = 0;
            CommsInterface::setRxStatus((CommsInterface *)this,CONNECTED);
            goto LAB_00231ead;
          }
          if (M.messageID == 0x9db) {
            status = TERMINATED;
          }
          else {
            status = ERRORED;
            if ((M.messageID != 0xa3f) && (M.messageID != 0xaa6)) {
              if (M.messageID != 0xed3) {
                if (M.messageID != 0x5ab) goto LAB_00231d2b;
                NetworkCommsInterface::loadPortDefinitions(&this->super_NetworkCommsInterface,&M);
                goto LAB_00231d42;
              }
              sdata.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x2;
              std::this_thread::sleep_for<long,std::ratio<1l,1l>>
                        ((duration<long,_std::ratio<1L,_1L>_> *)&sdata);
              goto LAB_00231e69;
            }
          }
          LOCK();
          (this->super_NetworkCommsInterface).super_CommsInterface.disconnecting._M_base._M_i = true
          ;
          UNLOCK();
        }
        CommsInterface::setRxStatus((CommsInterface *)this,status);
        iVar5 = -1;
      }
      goto LAB_00231ead;
    }
    if ((this->super_NetworkCommsInterface).super_CommsInterface.serverMode == true) {
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&sdata,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&M.stringData);
      if ((long)sdata.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)sdata.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x60) {
        local_1c0._M_len = M.payload.bufferSize;
        local_1c0._M_str = (char *)M.payload.heap;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::
        _M_emplace_unique<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string&>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)connection_info,&local_1c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (sdata.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 2));
      }
      else {
        local_1c0._M_len = M.payload.bufferSize;
        local_1c0._M_str = (char *)M.payload.heap;
        local_40._M_len = M.payload.bufferSize;
        local_40._M_str = (char *)M.payload.heap;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::
        _M_emplace_unique<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)connection_info,&local_1c0,&local_40);
      }
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&sdata);
      iVar5 = 3;
      goto LAB_00231ead;
    }
  }
  else if (M.messageAction == cmd_invalid) {
    out = std::operator<<((ostream *)&std::cerr,"invalid command received");
    ActionMessage::ActionMessage((ActionMessage *)&sdata,M.messageAction);
    poVar4 = helics::operator<<((ostream *)out,(ActionMessage *)&sdata);
    std::endl<char,std::char_traits<char>>((ostream *)poVar4);
    ActionMessage::~ActionMessage((ActionMessage *)&sdata);
  }
  else {
LAB_00231d2b:
    std::function<void_(helics::ActionMessage_&&)>::operator()
              (&(this->super_NetworkCommsInterface).super_CommsInterface.ActionCallback,&M);
  }
LAB_00231d42:
  iVar5 = 0;
LAB_00231ead:
  ActionMessage::~ActionMessage(&M);
  return iVar5;
}

Assistant:

int ZmqCommsSS::processIncomingMessage(zmq::message_t& msg,
                                       std::map<std::string, std::string>& connection_info)
{
    int status = 0;
    if (msg.size() == 5) {
        std::string str(static_cast<char*>(msg.data()), msg.size());
        if (str == "close") {
            return (-1);
        }
    }
    ActionMessage M(static_cast<std::byte*>(msg.data()), msg.size());

    if (!isValidCommand(M)) {
        std::cerr << "invalid command received" << M.action() << std::endl;
        return 0;
    }
    bool handled{false};
    if (isProtocolCommand(M)) {
        handled = true;
        switch (M.messageID) {
            case PORT_DEFINITIONS:
                loadPortDefinitions(M);
                break;
            case NAME_NOT_FOUND:
                disconnecting = true;
                setRxStatus(ConnectionStatus::ERRORED);
                status = -1;
                break;
            case CONNECTION_ACK:
                setTxStatus(ConnectionStatus::CONNECTED);
                break;
            case DISCONNECT:
                disconnecting = true;
                setRxStatus(ConnectionStatus::TERMINATED);
                status = -1;
                break;
            case DISCONNECT_ERROR:
                disconnecting = true;
                setRxStatus(ConnectionStatus::ERRORED);
                status = -1;
                break;
            case CLOSE_RECEIVER:
                setRxStatus(ConnectionStatus::TERMINATED);
                status = -1;
                break;
            case RECONNECT_RECEIVER:
                setRxStatus(ConnectionStatus::CONNECTED);
                break;
            case CONNECTION_INFORMATION:
                if (serverMode) {
                    auto sdata = M.getStringData();
                    if (sdata.size() == 3) {
                        connection_info.emplace(M.name(), sdata[2]);
                    } else {
                        connection_info.emplace(M.name(), M.payload.to_string());
                    }
                    status = 3;
                }
                break;
            case NEW_BROKER_INFORMATION: {
                logMessage("got new broker information");
                auto brkprt = gmlc::networking::extractInterfaceAndPort(M.getString(0));
                brokerPort = brkprt.second;
                if (brkprt.first != "?") {
                    brokerTargetAddress = brkprt.first;
                }
                status = 5;
            } break;
            case DELAY_CONNECTION:
                std::this_thread::sleep_for(std::chrono::seconds(2));
                status = 5;  // need to reconnect after this
                break;
            default:
                handled = false;
                break;
        }
    }
    if (!handled) {
        ActionCallback(std::move(M));
    }
    return status;
}